

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

rt_return_value_t rt_free_context(rt_context_pointer *context)

{
  int *piVar1;
  int local_1c;
  int i;
  rt_context_t *c;
  rt_context_pointer *context_local;
  
  piVar1 = (int *)*context;
  for (local_1c = 0; local_1c < *piVar1; local_1c = local_1c + 1) {
    if (*(int *)(*(long *)(piVar1 + 2) + (long)local_1c * 0x10) == 0) {
      (*rt_variable_free_func)(*(void **)(*(long *)(piVar1 + 2) + (long)local_1c * 0x10 + 8));
    }
  }
  (*rt_free_func)(*(void **)(piVar1 + 2));
  (*rt_free_func)(*(void **)(piVar1 + 6));
  for (local_1c = 0; local_1c < piVar1[8]; local_1c = local_1c + 1) {
    (*rt_free_func)(*(void **)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x10));
    (*rt_free_func)(*(void **)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x20));
    (**(code **)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x30))
              (*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 8);
    if (*(long *)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x38) != 0) {
      (*rt_free_func)(*(void **)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x38));
      *(undefined8 *)(*(long *)(piVar1 + 10) + (long)local_1c * 0x40 + 0x38) = 0;
    }
  }
  (*rt_free_func)(*(void **)(piVar1 + 10));
  (*rt_free_func)(*(void **)(piVar1 + 0xe));
  (*rt_free_func)(*(void **)(piVar1 + 0x12));
  if (*(long *)(piVar1 + 0x16) != 0) {
    (*rt_free_func)(*(void **)(piVar1 + 0x16));
  }
  (*rt_free_func)(*context);
  return RT_RET_NOERROR;
}

Assistant:

rt_return_value_t rt_free_context(rt_context_pointer *context) {
  rt_context_t *c = *context;

  int i; // Iterator

  // Buffers
  for (i = 0; i < c->num_of_buffers; i++) {
    if (c->buffers[i].allocate_type == RT_BUFFER_ALLOCATE_TYPE_MALLOC) {
      rt_variable_free_func(c->buffers[i].buffer);
    }
  }
  rt_free_func(c->buffers);

  // Variables
  rt_free_func(c->variables);

  // Functions
  for (i = 0; i < c->num_of_functions; i++) {
    rt_free_func(c->functions[i].func.inputs);
    rt_free_func(c->functions[i].func.outputs);

    c->functions[i].func.free_local_context_func(&(c->functions[i].func));
    if (c->functions[i].func.local_context != 0) {
      rt_free_func(c->functions[i].func.local_context);
      c->functions[i].func.local_context = NULL;
    }
  }
  rt_free_func(c->functions);

  rt_free_func(c->input_variable_ids);
  rt_free_func(c->output_variable_ids);

  // Callback
  if (c->callbacks) {
    rt_free_func(c->callbacks);
  }

  rt_free_func(*context);
  return RT_RET_NOERROR;
}